

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  expkind eVar1;
  ravi_type_map rVar2;
  OpCode o;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TString *pTVar6;
  uint uVar7;
  int iVar8;
  TString *pTVar9;
  LexState *ls;
  OpCode OVar10;
  char *pcVar11;
  char acStack_c8 [80];
  char var_type_map_str [80];
  
  eVar1 = var->k;
  if (eVar1 == VINDEXED) {
    iVar3 = luaK_exp2RK(fs,ex);
    if ((var->u).ind.vt == '\b') {
      rVar2 = (var->u).ind.key_ravi_type_map;
      OVar10 = OP_SETTABLE;
      if (rVar2 == 0x100) {
        iVar8 = isshortstr(fs,(int)(var->u).ind.idx);
        if (iVar8 != 0) {
          OVar10 = OP_RAVI_SETFIELD;
          if (var->ravi_type_map == 0x80) {
            OVar10 = OP_RAVI_TABLE_SETFIELD;
          }
        }
      }
      else if (rVar2 == 8) {
        if (var->ravi_type_map == 0x20) {
          OVar10 = (uint)(ex->ravi_type_map == 8) * 2 + OP_RAVI_IARRAY_SET;
        }
        else if (var->ravi_type_map == 0x40) {
          OVar10 = (uint)(ex->ravi_type_map == 0x10) * 2 + OP_RAVI_FARRAY_SET;
        }
        else {
          OVar10 = OP_RAVI_SETI;
        }
      }
    }
    else {
      OVar10 = OP_SETTABUP;
    }
    uVar5 = (uint)(var->u).ind.t;
    iVar8 = (int)(var->u).ind.idx;
    goto LAB_00141670;
  }
  if (eVar1 == VUPVAL) {
    uVar5 = luaK_exp2anyreg(fs,ex);
    uVar4 = var->ravi_type_map;
    OVar10 = OP_SETUPVAL;
    if (((((uVar4 - 8 < 0x39) && ((0x100000001000101U >> ((ulong)(uVar4 - 8) & 0x3f) & 1) != 0)) ||
         (uVar4 == 0x80)) || (((uVar4 == 0x101 || (uVar4 == 0x401)) || (uVar4 == 0x201)))) &&
       ((~uVar4 & ex->ravi_type_map) != 0)) {
      if (uVar4 == 8) {
        OVar10 = OP_RAVI_SETUPVALI;
      }
      else if (uVar4 == 0x401) {
        uVar4 = luaK_stringK(fs,fs->f->upvalues[(var->u).info].usertype);
        luaK_codeABx(fs,OP_RAVI_TOTYPE,uVar5,uVar4);
      }
      else if (uVar4 == 0x20) {
        OVar10 = OP_RAVI_SETUPVAL_IARRAY;
      }
      else if (uVar4 == 0x40) {
        OVar10 = OP_RAVI_SETUPVAL_FARRAY;
      }
      else if (uVar4 == 0x80) {
        OVar10 = OP_RAVI_SETUPVALT;
      }
      else {
        if (uVar4 == 0x101) {
          o = OP_RAVI_TOSTRING;
        }
        else {
          if (uVar4 != 0x201) {
            if (uVar4 != 0x10) {
              raviY_typemap_string(uVar4,var_type_map_str);
              raviY_typemap_string(ex->ravi_type_map,acStack_c8);
              ls = fs->ls;
              pcVar11 = luaO_pushfstring(ls->L,
                                         "Invalid assignment of upvalue: upvalue type %s, expression type %s"
                                         ,var_type_map_str,acStack_c8);
              goto LAB_0014186a;
            }
            OVar10 = OP_RAVI_SETUPVALF;
            goto LAB_00141661;
          }
          o = OP_RAVI_TOCLOSURE;
        }
        luaK_codeABC(fs,o,uVar5,0,0);
      }
    }
LAB_00141661:
    iVar8 = (var->u).info;
    iVar3 = 0;
LAB_00141670:
    luaK_codeABC(fs,OVar10,uVar5,iVar8,iVar3);
    freeexp(fs,ex);
    return;
  }
  if (eVar1 != VLOCAL) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x429,"void luaK_storevar(FuncState *, expdesc *, expdesc *)");
  }
  uVar5 = var->ravi_type_map;
  if ((ex->k == VNONRELOC) &&
     (((uVar5 - 8 < 0x39 && ((0x100000001000101U >> ((ulong)(uVar5 - 8) & 0x3f) & 1) != 0)) ||
      ((uVar5 == 0x80 || (((uVar5 == 0x101 || (uVar5 == 0x201)) || (uVar5 == 0x401))))))))
  goto LAB_00141564;
  uVar4 = ex->ravi_type_map;
  uVar7 = 8;
  if (uVar4 != 0x20) {
    uVar7 = -(uint)(uVar4 != 0x40) | 0x10;
  }
  if (ex->k != VINDEXED) {
    uVar7 = uVar4;
  }
  if (uVar5 == 8) {
    if (uVar7 == 8) goto LAB_00141564;
    if (uVar7 != 0xffffffff) {
      ls = fs->ls;
      pcVar11 = "Invalid assignment: integer expected";
      goto LAB_0014179b;
    }
    iVar3 = luaK_exp2RK(fs,ex);
    OVar10 = OP_RAVI_TOINT;
  }
  else {
    if (uVar5 != 0x10) {
      if ((uVar5 & 0xffffff1f) == 0) {
        if (uVar7 == uVar5) goto LAB_00141564;
        if (uVar7 == 0xffffffff) {
          OVar10 = OP_RAVI_TOIARRAY;
          if ((uVar5 & 0x20) == 0) {
            OVar10 = ((uVar5 & 0x40) == 0) + OP_RAVI_TOFARRAY;
          }
          iVar3 = luaK_exp2RK(fs,ex);
          goto LAB_00141558;
        }
        ls = fs->ls;
        pcVar11 = "@integer[]";
        if (uVar5 == 0x40) {
          pcVar11 = "@number[]";
        }
        pTVar9 = (TString *)0x1574e7;
        if (uVar5 != 0x80) {
          pTVar9 = (TString *)(pcVar11 + 1);
        }
        pcVar11 = "Invalid assignment: %s expected";
      }
      else {
        if (uVar5 != 0x401) {
          if (uVar5 == 0x201) {
            if ((uVar7 & 0xfffffdfe) == 0) goto LAB_00141564;
            if (uVar7 != 0xffffffff) {
              ls = fs->ls;
              pcVar11 = "Invalid assignment: function expected";
              goto LAB_0014179b;
            }
            iVar3 = luaK_exp2RK(fs,ex);
            OVar10 = OP_RAVI_TOCLOSURE;
          }
          else {
            if ((uVar5 != 0x101) || ((uVar7 & 0xfffffefe) == 0)) goto LAB_00141564;
            if (uVar7 != 0xffffffff) {
              ls = fs->ls;
              pcVar11 = "Invalid assignment: string expected";
LAB_0014179b:
              pcVar11 = luaO_pushfstring(ls->L,pcVar11);
              goto LAB_0014186a;
            }
            iVar3 = luaK_exp2RK(fs,ex);
            OVar10 = OP_RAVI_TOSTRING;
          }
          goto LAB_00141558;
        }
        if ((uVar7 & 0xfffffbfe) == 0) {
          if (uVar7 < 0x400) goto LAB_00141564;
          pTVar6 = var->usertype;
          if (pTVar6 == (TString *)0x0) {
            pTVar6 = (TString *)0x0;
          }
          else if (pTVar6 == ex->usertype) goto LAB_00141564;
        }
        else {
          if (uVar7 == 0xffffffff) {
            iVar3 = luaK_exp2RK(fs,ex);
            uVar5 = luaK_stringK(fs,var->usertype);
            luaK_codeABx(fs,OP_RAVI_TOTYPE,iVar3,uVar5);
            goto LAB_00141564;
          }
          pTVar6 = var->usertype;
        }
        ls = fs->ls;
        pcVar11 = "Invalid assignment: usertype %s expected";
        pTVar9 = (TString *)"UNKNOWN";
        if (pTVar6 != (TString *)0x0) {
          pTVar9 = pTVar6 + 1;
        }
      }
      pcVar11 = luaO_pushfstring(ls->L,pcVar11,pTVar9);
LAB_0014186a:
      luaX_syntaxerror(ls,pcVar11);
    }
    if (uVar7 == 0x10) goto LAB_00141564;
    if (uVar7 != 0xffffffff) {
      ls = fs->ls;
      pcVar11 = "Invalid assignment: number expected";
      goto LAB_0014179b;
    }
    iVar3 = luaK_exp2RK(fs,ex);
    OVar10 = OP_RAVI_TOFLT;
  }
LAB_00141558:
  luaK_codeABC(fs,OVar10,iVar3,0,0);
LAB_00141564:
  freeexp(fs,ex);
  exp2reg(fs,ex,(var->u).info);
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      check_valid_store(fs, var, ex);
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      OpCode op = check_valid_setupval(fs, var, ex, e);
      luaK_codeABC(fs, op, e, var->u.info, 0);
      break;
    }
    case VINDEXED: {
      OpCode op;
      int e = luaK_exp2RK(fs, ex);
      if (var->u.ind.vt == VLOCAL) {
        /* table value set - if array access then use specialized versions */
        if (var->u.ind.key_ravi_type_map == RAVI_TM_INTEGER) {
          if (var->ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_FLOAT ? OP_RAVI_FARRAY_SETF : OP_RAVI_FARRAY_SET;
          } else if (var->ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_INTEGER ? OP_RAVI_IARRAY_SETI : OP_RAVI_IARRAY_SET;
          } else {
            op = OP_RAVI_SETI;
          }
        } else if (var->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, var->u.ind.idx)) {
          op = var->ravi_type_map == RAVI_TM_TABLE ? OP_RAVI_TABLE_SETFIELD : OP_RAVI_SETFIELD;
        } else {
          op = OP_SETTABLE;
        }
      } else {
        op = OP_SETTABUP;
      }
      luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}